

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unistr.cpp
# Opt level: O2

int32_t __thiscall
icu_63::UnicodeString::doLastIndexOf(UnicodeString *this,UChar32 c,int32_t start,int32_t length)

{
  UChar *pUVar1;
  char16_t *pcVar2;
  int32_t local_18;
  int local_14;
  
  local_18 = length;
  local_14 = start;
  pinIndices(this,&local_14,&local_18);
  if (((this->fUnion).fStackFields.fLengthAndFlags & 2U) == 0) {
    pcVar2 = (this->fUnion).fFields.fArray;
  }
  else {
    pcVar2 = (char16_t *)((long)&this->fUnion + 2);
  }
  pUVar1 = u_memrchr32_63(pcVar2 + local_14,c,local_18);
  return -(uint)(pUVar1 == (UChar *)0x0) | (uint)((ulong)((long)pUVar1 - (long)pcVar2) >> 1);
}

Assistant:

int32_t
UnicodeString::doLastIndexOf(UChar32 c,
                             int32_t start,
                             int32_t length) const {
  // pin indices
  pinIndices(start, length);

  // find the last occurrence of c
  const UChar *array = getArrayStart();
  const UChar *match = u_memrchr32(array + start, c, length);
  if(match == NULL) {
    return -1;
  } else {
    return (int32_t)(match - array);
  }
}